

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiStorage::SetFloat(ImGuiStorage *this,ImGuiID key,float val)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  Pair *__dest;
  ImGuiContext *pIVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  Pair *pPVar9;
  int iVar10;
  long lVar11;
  
  pIVar4 = GImGui;
  uVar2 = (this->Data).Size;
  lVar7 = (long)(int)uVar2;
  __dest = (this->Data).Data;
  pPVar9 = __dest;
  uVar5 = uVar2;
  if (0 < lVar7) {
    do {
      uVar3 = uVar5 >> 1;
      uVar6 = uVar3;
      if (pPVar9[uVar3].key < key) {
        uVar6 = uVar5 + ~uVar3;
        pPVar9 = pPVar9 + (ulong)uVar3 + 1;
      }
      uVar5 = uVar6;
    } while (0 < (int)uVar6);
  }
  if ((pPVar9 != __dest + lVar7) && (pPVar9->key == key)) {
    (pPVar9->field_1).val_f = val;
    return;
  }
  if ((pPVar9 < __dest) || (__dest + lVar7 < pPVar9)) {
    __assert_fail("it >= Data && it <= Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x373,
                  "iterator ImVector<ImGuiStorage::Pair>::insert(const_iterator, const value_type &) [T = ImGuiStorage::Pair]"
                 );
  }
  lVar11 = (long)pPVar9 - (long)__dest;
  if (uVar2 != (this->Data).Capacity) goto LAB_0012ec65;
  iVar10 = 4;
  if (uVar2 != 0) {
    iVar10 = uVar2 * 2;
  }
  if (iVar10 <= (int)uVar2) goto LAB_0012ec65;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (Pair *)(*(pIVar4->IO).MemAllocFn)((long)iVar10 << 4);
  pPVar9 = (this->Data).Data;
  if (pPVar9 == (Pair *)0x0) {
LAB_0012ec4c:
    pPVar9 = (Pair *)0x0;
    pIVar4 = GImGui;
  }
  else {
    memcpy(__dest,pPVar9,(long)(this->Data).Size << 4);
    pIVar4 = GImGui;
    pPVar9 = (this->Data).Data;
    if (pPVar9 == (Pair *)0x0) goto LAB_0012ec4c;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar4->IO).MemFreeFn)(pPVar9);
  (this->Data).Data = __dest;
  (this->Data).Capacity = iVar10;
  lVar7 = (long)(this->Data).Size;
LAB_0012ec65:
  lVar8 = lVar7 - (lVar11 >> 4);
  if (lVar8 != 0 && lVar11 >> 4 <= lVar7) {
    memmove((void *)((long)__dest + lVar11 + 0x10),(void *)((long)__dest + lVar11),lVar8 * 0x10);
    __dest = (this->Data).Data;
  }
  *(ImGuiID *)((long)__dest + lVar11) = key;
  *(float *)((long)__dest + lVar11 + 8) = val;
  (this->Data).Size = (this->Data).Size + 1;
  return;
}

Assistant:

void ImGuiStorage::SetFloat(ImGuiID key, float val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, Pair(key, val));
        return;
    }
    it->val_f = val;
}